

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

uint32_t helper_trXX(CPUS390XState_conflict *env,uint32_t r1,uint32_t r2,uint32_t tst,uint32_t sizes
                    )

{
  _Bool _Var1;
  int wordsize;
  int wordsize_00;
  uint64_t uVar2;
  uintptr_t unaff_retaddr;
  uint16_t dval;
  uint64_t tble;
  int local_58;
  uint32_t uStack_54;
  uint16_t sval;
  int i;
  uint32_t cc;
  uint64_t src;
  uint64_t len;
  uint64_t dst;
  uint64_t tbl;
  int ssize;
  int dsize;
  uintptr_t ra;
  uint32_t sizes_local;
  uint32_t tst_local;
  uint32_t r2_local;
  uint32_t r1_local;
  CPUS390XState_conflict *env_local;
  
  wordsize = 2;
  if ((sizes & 1) != 0) {
    wordsize = 1;
  }
  wordsize_00 = 2;
  if ((sizes & 2) != 0) {
    wordsize_00 = 1;
  }
  uVar2 = get_address(env,1);
  len = get_address(env,r1);
  src = get_length(env,r1 + 1);
  _i = get_address(env,r2);
  uStack_54 = 3;
  if (wordsize_00 == 2) {
    _Var1 = s390_has_feat(env->uc,S390_FEAT_ETF2_ENH);
    if (!_Var1) {
      dst = uVar2 & 0xfffffffffffff000;
      goto LAB_0124fe2a;
    }
  }
  dst = uVar2 & 0xfffffffffffffff8;
LAB_0124fe2a:
  check_alignment(env,src,wordsize_00,unaff_retaddr);
  local_58 = 0;
  do {
    if (0x1fff < local_58) {
LAB_0124ff0b:
      set_address(env,r1,len);
      set_length(env,r1 + 1,src);
      set_address(env,r2,_i);
      return uStack_54;
    }
    uVar2 = cpu_ldusize_data_ra(env,_i,wordsize_00,unaff_retaddr);
    uVar2 = cpu_ldusize_data_ra(env,dst + (long)(int)((uint)(ushort)uVar2 * wordsize),wordsize,
                                unaff_retaddr);
    if ((ushort)uVar2 == tst) {
      uStack_54 = 1;
      goto LAB_0124ff0b;
    }
    cpu_stsize_data_ra(env,len,uVar2 & 0xffff,wordsize,unaff_retaddr);
    src = src - (long)wordsize_00;
    _i = (long)wordsize_00 + _i;
    len = (long)wordsize + len;
    if (src == 0) {
      uStack_54 = 0;
      goto LAB_0124ff0b;
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

uint32_t HELPER(trXX)(CPUS390XState *env, uint32_t r1, uint32_t r2,
                      uint32_t tst, uint32_t sizes)
{
    uintptr_t ra = GETPC();
    int dsize = (sizes & 1) ? 1 : 2;
    int ssize = (sizes & 2) ? 1 : 2;
    uint64_t tbl = get_address(env, 1);
    uint64_t dst = get_address(env, r1);
    uint64_t len = get_length(env, r1 + 1);
    uint64_t src = get_address(env, r2);
    uint32_t cc = 3;
    int i;

    /* The lower address bits of TBL are ignored.  For TROO, TROT, it's
       the low 3 bits (double-word aligned).  For TRTO, TRTT, it's either
       the low 12 bits (4K, without ETF2-ENH) or 3 bits (with ETF2-ENH).  */
    if (ssize == 2 && !s390_has_feat(env->uc, S390_FEAT_ETF2_ENH)) {
        tbl &= -4096;
    } else {
        tbl &= -8;
    }

    check_alignment(env, len, ssize, ra);

    /* Lest we fail to service interrupts in a timely manner, */
    /* limit the amount of work we're willing to do.   */
    for (i = 0; i < 0x2000; i++) {
        uint16_t sval = cpu_ldusize_data_ra(env, src, ssize, ra);
        uint64_t tble = tbl + (sval * dsize);
        uint16_t dval = cpu_ldusize_data_ra(env, tble, dsize, ra);
        if (dval == tst) {
            cc = 1;
            break;
        }
        cpu_stsize_data_ra(env, dst, dval, dsize, ra);

        len -= ssize;
        src += ssize;
        dst += dsize;

        if (len == 0) {
            cc = 0;
            break;
        }
    }

    set_address(env, r1, dst);
    set_length(env, r1 + 1, len);
    set_address(env, r2, src);

    return cc;
}